

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_policy_format_binary.c
# Opt level: O1

size_t log_policy_format_binary_deserialize
                 (log_policy policy,log_record record,void *buffer,size_t size)

{
  log_policy_instance(policy);
  return size;
}

Assistant:

static size_t log_policy_format_binary_deserialize(log_policy policy, log_record record, const void *buffer, const size_t size)
{
	log_policy_format_binary_data binary_data = log_policy_instance(policy);

	(void)binary_data;
	(void)record;
	(void)buffer;
	(void)size;

	return size;
}